

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatCopy(SUNMatrix A,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix B_00;
  double dVar3;
  double dVar4;
  realtype tol;
  SUNMatrix B;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNMatrix A_local;
  
  B_00 = SUNMatClone(A);
  dVar3 = get_time();
  uVar1 = SUNMatCopy(A,B_00);
  dVar4 = get_time();
  if (uVar1 == 0) {
    iVar2 = check_matrix(B_00,A,2.220446049250313e-15);
    if (iVar2 == 0) {
      if ((myid == 0) && (printf("    PASSED test -- SUNMatCopy \n"), print_time != 0)) {
        printf("    SUNMatCopy Time: %22.15e \n \n",dVar4 - dVar3);
      }
      SUNMatDestroy(B_00);
      A_local._4_4_ = 0;
    }
    else {
      printf(">>> FAILED test -- SUNMatCopy check, Proc %d \n",(ulong)(uint)myid);
      if (print_time != 0) {
        printf("    SUNMatCopy Time: %22.15e \n \n",dVar4 - dVar3);
      }
      SUNMatDestroy(B_00);
      A_local._4_4_ = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",(ulong)uVar1,(ulong)(uint)myid)
    ;
    SUNMatDestroy(B_00);
    A_local._4_4_ = 1;
  }
  return A_local._4_4_;
}

Assistant:

int Test_SUNMatCopy(SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;
  SUNMatrix B;
  realtype  tol=10*UNIT_ROUNDOFF;

  B = SUNMatClone(A);

  /* copy matrix data */
  start_time = get_time();
  failure = SUNMatCopy(A, B);
  stop_time = get_time();

  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",
           failure, myid);
    SUNMatDestroy(B);
    return(1);
  }

  /* check matrix entries */
  failure = check_matrix(B, A, tol);

  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy check, Proc %d \n", myid);
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNMatCopy \n");
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return(0);
}